

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

void __thiscall OpenMD::ForceMatrixDecomposition::zeroWorkArrays(ForceMatrixDecomposition *this)

{
  uint uVar1;
  Snapshot *pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pVVar5;
  pointer pVVar6;
  long lVar7;
  
  (this->super_ForceDecomposition).pairwisePot.data_[4] = 0.0;
  (this->super_ForceDecomposition).pairwisePot.data_[5] = 0.0;
  (this->super_ForceDecomposition).pairwisePot.data_[2] = 0.0;
  (this->super_ForceDecomposition).pairwisePot.data_[3] = 0.0;
  (this->super_ForceDecomposition).pairwisePot.data_[0] = 0.0;
  (this->super_ForceDecomposition).pairwisePot.data_[1] = 0.0;
  (this->super_ForceDecomposition).pairwisePot.data_[6] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[0] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[1] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[2] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[3] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[4] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[5] = 0.0;
  (this->super_ForceDecomposition).selfPot.data_[6] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[0] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[1] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[2] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[3] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[4] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[5] = 0.0;
  (this->super_ForceDecomposition).excludedPot.data_[6] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[0] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[1] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[2] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[3] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[4] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[5] = 0.0;
  (this->super_ForceDecomposition).excludedSelfPot.data_[6] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[4] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[5] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[2] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[3] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[0] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[1] = 0.0;
  (this->super_ForceDecomposition).selectedPot.data_[6] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[6] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[4] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[5] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[2] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[3] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[0] = 0.0;
  (this->super_ForceDecomposition).selectedSelfPot.data_[1] = 0.0;
  uVar1 = (this->super_ForceDecomposition).atomStorageLayout_;
  if ((uVar1 & 0x40) != 0) {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pdVar3 = (pSVar2->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  if ((char)uVar1 < '\0') {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pdVar3 = (pSVar2->atomData).density.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->atomData).density.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  if ((uVar1 >> 8 & 1) != 0) {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pdVar3 = (pSVar2->atomData).functional.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->atomData).functional.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  if ((uVar1 >> 9 & 1) != 0) {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pdVar3 = (pSVar2->atomData).functionalDerivative.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar4 = (pSVar2->atomData).functionalDerivative.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pdVar3 = (pSVar2->atomData).skippedCharge.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->atomData).skippedCharge.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
    }
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pVVar5 = (pSVar2->atomData).electricField.
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pVVar6 = (pSVar2->atomData).electricField.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pVVar6 != pVVar5; pVVar6 = pVVar6 + 1)
    {
      if (pVVar6 != (pointer)&OpenMD::V3Zero) {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar7) =
               *(undefined8 *)((long)&OpenMD::V3Zero + lVar7);
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x18);
      }
    }
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    pSVar2 = (this->super_ForceDecomposition).snap_;
    pdVar3 = (pSVar2->atomData).sitePotential.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->atomData).sitePotential.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      memset(pdVar3,0,((long)pdVar4 + (-8 - (long)pdVar3) & 0xfffffffffffffff8U) + 8);
      return;
    }
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::zeroWorkArrays() {
    pairwisePot     = 0.0;
    selfPot         = 0.0;
    excludedPot     = 0.0;
    excludedSelfPot = 0.0;
    selectedPot     = 0.0;
    selectedSelfPot = 0.0;

#ifdef IS_MPI
    if (atomStorageLayout_ & DataStorage::dslForce) {
      fill(atomRowData.force.begin(), atomRowData.force.end(), V3Zero);
      fill(atomColData.force.begin(), atomColData.force.end(), V3Zero);
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      fill(atomRowData.torque.begin(), atomRowData.torque.end(), V3Zero);
      fill(atomColData.torque.begin(), atomColData.torque.end(), V3Zero);
    }

    fill(pot_row.begin(), pot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(pot_col.begin(), pot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(expot_row.begin(), expot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(expot_col.begin(), expot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(selepot_row.begin(), selepot_row.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    fill(selepot_col.begin(), selepot_col.end(),
         Vector<RealType, N_INTERACTION_FAMILIES>(0.0));

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      fill(atomRowData.particlePot.begin(), atomRowData.particlePot.end(), 0.0);
      fill(atomColData.particlePot.begin(), atomColData.particlePot.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      fill(atomRowData.density.begin(), atomRowData.density.end(), 0.0);
      fill(atomColData.density.begin(), atomColData.density.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      fill(atomRowData.functional.begin(), atomRowData.functional.end(), 0.0);
      fill(atomColData.functional.begin(), atomColData.functional.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      fill(atomRowData.functionalDerivative.begin(),
           atomRowData.functionalDerivative.end(), 0.0);
      fill(atomColData.functionalDerivative.begin(),
           atomColData.functionalDerivative.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      fill(atomRowData.skippedCharge.begin(), atomRowData.skippedCharge.end(),
           0.0);
      fill(atomColData.skippedCharge.begin(), atomColData.skippedCharge.end(),
           0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      fill(atomRowData.flucQFrc.begin(), atomRowData.flucQFrc.end(), 0.0);
      fill(atomColData.flucQFrc.begin(), atomColData.flucQFrc.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      fill(atomRowData.electricField.begin(), atomRowData.electricField.end(),
           V3Zero);
      fill(atomColData.electricField.begin(), atomColData.electricField.end(),
           V3Zero);
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      fill(atomRowData.sitePotential.begin(), atomRowData.sitePotential.end(),
           0.0);
      fill(atomColData.sitePotential.begin(), atomColData.sitePotential.end(),
           0.0);
    }

#endif
    // even in parallel, we need to zero out the local arrays:

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      fill(snap_->atomData.particlePot.begin(),
           snap_->atomData.particlePot.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      fill(snap_->atomData.density.begin(), snap_->atomData.density.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      fill(snap_->atomData.functional.begin(), snap_->atomData.functional.end(),
           0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      fill(snap_->atomData.functionalDerivative.begin(),
           snap_->atomData.functionalDerivative.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      fill(snap_->atomData.skippedCharge.begin(),
           snap_->atomData.skippedCharge.end(), 0.0);
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      fill(snap_->atomData.electricField.begin(),
           snap_->atomData.electricField.end(), V3Zero);
    }
    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      fill(snap_->atomData.sitePotential.begin(),
           snap_->atomData.sitePotential.end(), 0.0);
    }
  }